

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ParseTokenize(void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  sqlite3_uint64 n;
  undefined8 *puVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  void *__s;
  int iVar5;
  int iVar6;
  undefined8 *pOld;
  uint uVar7;
  long in_FS_OFFSET;
  int rc;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rc = 0;
  iVar6 = *(int *)((long)pContext + 0x10);
  if (iVar6 != 0) goto LAB_001c6db7;
  pOld = *pContext;
  iVar5 = 0x8000;
  if (nToken < 0x8000) {
    iVar5 = nToken;
  }
  if (pOld == (undefined8 *)0x0) {
    uVar7 = 0;
LAB_001c6c5a:
    puVar1 = (undefined8 *)sqlite3_realloc64(pOld,(long)(int)(uVar7 + 8) * 0x28 + 0x48);
    if (puVar1 == (undefined8 *)0x0) {
LAB_001c6daf:
      iVar6 = 7;
    }
    else {
      if (pOld == (undefined8 *)0x0) {
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[8] = 0;
      }
      *(undefined8 **)pContext = puVar1;
      *(uint *)(puVar1 + 3) = uVar7;
      pOld = puVar1;
LAB_001c6caa:
      *(uint *)(pOld + 3) = uVar7 + 1;
      lVar2 = (long)(int)uVar7;
      pOld[lVar2 * 5 + 6] = 0;
      (pOld + lVar2 * 5 + 6)[1] = 0;
      pOld[lVar2 * 5 + 4] = 0;
      (pOld + lVar2 * 5 + 4)[1] = 0;
      pOld[lVar2 * 5 + 8] = 0;
      pcVar3 = sqlite3Fts5Strndup(&rc,pToken,iVar5);
      pOld[lVar2 * 5 + 5] = pcVar3;
      *(int *)(pOld + lVar2 * 5 + 6) = iVar5;
      *(int *)((long)pOld + lVar2 * 0x28 + 0x34) = iVar5;
      iVar6 = rc;
      if (rc == 0 && *(int *)(*(long *)((long)pContext + 8) + 0x6c) != 0) {
        sVar4 = strlen(pcVar3);
        *(int *)(pOld + lVar2 * 5 + 6) = (int)sVar4;
        iVar6 = 0;
      }
    }
  }
  else {
    uVar7 = *(uint *)(pOld + 3);
    if ((tflags & 1U) == 0 || (int)uVar7 < 1) {
      if ((uVar7 & 7) == 0) goto LAB_001c6c5a;
      goto LAB_001c6caa;
    }
    n = (long)iVar5 + 0x39;
    __s = sqlite3_malloc64(n);
    if (__s == (void *)0x0) goto LAB_001c6daf;
    iVar6 = 0;
    memset(__s,0,n);
    pcVar3 = (char *)((long)__s + 0x38);
    *(char **)((long)__s + 8) = pcVar3;
    *(int *)((long)__s + 0x10) = iVar5;
    *(int *)((long)__s + 0x14) = iVar5;
    if (*(int *)(*(long *)((long)pContext + 8) + 0x6c) != 0) {
      sVar4 = strlen(pcVar3);
      *(int *)((long)__s + 0x10) = (int)sVar4;
    }
    memcpy(pcVar3,pToken,(long)iVar5);
    iVar5 = *(int *)(pOld + 3);
    *(undefined8 *)((long)__s + 0x20) = pOld[(long)iVar5 * 5 + 3];
    pOld[(long)iVar5 * 5 + 3] = __s;
  }
  *(int *)((long)pContext + 0x10) = iVar6;
LAB_001c6db7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int fts5ParseTokenize(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  int rc = SQLITE_OK;
  const int SZALLOC = 8;
  TokenCtx *pCtx = (TokenCtx*)pContext;
  Fts5ExprPhrase *pPhrase = pCtx->pPhrase;

  UNUSED_PARAM2(iUnused1, iUnused2);

  /* If an error has already occurred, this is a no-op */
  if( pCtx->rc!=SQLITE_OK ) return pCtx->rc;
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( pPhrase && pPhrase->nTerm>0 && (tflags & FTS5_TOKEN_COLOCATED) ){
    Fts5ExprTerm *pSyn;
    sqlite3_int64 nByte = sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer) + nToken+1;
    pSyn = (Fts5ExprTerm*)sqlite3_malloc64(nByte);
    if( pSyn==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pSyn, 0, (size_t)nByte);
      pSyn->pTerm = ((char*)pSyn) + sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer);
      pSyn->nFullTerm = pSyn->nQueryTerm = nToken;
      if( pCtx->pConfig->bTokendata ){
        pSyn->nQueryTerm = (int)strlen(pSyn->pTerm);
      }
      memcpy(pSyn->pTerm, pToken, nToken);
      pSyn->pSynonym = pPhrase->aTerm[pPhrase->nTerm-1].pSynonym;
      pPhrase->aTerm[pPhrase->nTerm-1].pSynonym = pSyn;
    }
  }else{
    Fts5ExprTerm *pTerm;
    if( pPhrase==0 || (pPhrase->nTerm % SZALLOC)==0 ){
      Fts5ExprPhrase *pNew;
      int nNew = SZALLOC + (pPhrase ? pPhrase->nTerm : 0);

      pNew = (Fts5ExprPhrase*)sqlite3_realloc64(pPhrase,
          sizeof(Fts5ExprPhrase) + sizeof(Fts5ExprTerm) * nNew
      );
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        if( pPhrase==0 ) memset(pNew, 0, sizeof(Fts5ExprPhrase));
        pCtx->pPhrase = pPhrase = pNew;
        pNew->nTerm = nNew - SZALLOC;
      }
    }

    if( rc==SQLITE_OK ){
      pTerm = &pPhrase->aTerm[pPhrase->nTerm++];
      memset(pTerm, 0, sizeof(Fts5ExprTerm));
      pTerm->pTerm = sqlite3Fts5Strndup(&rc, pToken, nToken);
      pTerm->nFullTerm = pTerm->nQueryTerm = nToken;
      if( pCtx->pConfig->bTokendata && rc==SQLITE_OK ){
        pTerm->nQueryTerm = (int)strlen(pTerm->pTerm);
      }
    }
  }

  pCtx->rc = rc;
  return rc;
}